

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::
     UniversalPrinter<Deque<int,_std::allocator<int>_>::DequeIterator<int,_int_&,_int_*,_Deque<int,_std::allocator<int>_>_>_>
     ::Print(DequeIterator<int,_int_&,_int_*,_Deque<int,_std::allocator<int>_>_> *value,ostream *os)

{
  DequeIterator<int,_int_&,_int_*,_Deque<int,_std::allocator<int>_>_> *in_RSI;
  ostream *in_stack_ffffffffffffffe8;
  
  PrintTo<Deque<int,std::allocator<int>>::DequeIterator<int,int&,int*,Deque<int,std::allocator<int>>>>
            (in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

static void Print(const T& value, ::std::ostream* os) {
    // By default, ::testing::internal::PrintTo() is used for printing
    // the value.
    //
    // Thanks to Koenig look-up, if T is a class and has its own
    // PrintTo() function defined in its namespace, that function will
    // be visible here.  Since it is more specific than the generic ones
    // in ::testing::internal, it will be picked by the compiler in the
    // following statement - exactly what we want.
    PrintTo(value, os);
  }